

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O0

blargg_err_t __thiscall Gme_File::track_info(Gme_File *this,track_info_t *out,int track)

{
  int iVar1;
  undefined4 extraout_var;
  entry_t *peVar2;
  uint in_EDX;
  long *in_RSI;
  Gme_File *in_RDI;
  entry_t *e;
  info_t *i;
  blargg_err_t blargg_return_err__1;
  blargg_err_t blargg_return_err_;
  int remapped;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int *in_stack_ffffffffffffffc0;
  Gme_File *in_stack_ffffffffffffffc8;
  blargg_err_t local_8;
  
  iVar1 = track_count(in_RDI);
  *in_RSI = (long)iVar1;
  in_RSI[1] = -1;
  in_RSI[3] = -1;
  in_RSI[2] = -1;
  *(undefined1 *)(in_RSI + 0x44) = 0;
  *(undefined1 *)(in_RSI + 0x24) = 0;
  *(undefined1 *)(in_RSI + 100) = 0;
  *(undefined1 *)(in_RSI + 0x84) = 0;
  *(undefined1 *)(in_RSI + 0xa4) = 0;
  *(undefined1 *)(in_RSI + 0xc4) = 0;
  *(undefined1 *)(in_RSI + 4) = 0;
  type(in_RDI);
  copy_field_((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_8 = remap_track_(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (local_8 == (blargg_err_t)0x0) {
    iVar1 = (*in_RDI->_vptr_Gme_File[5])(in_RDI,in_RSI,(ulong)in_EDX);
    local_8 = (blargg_err_t)CONCAT44(extraout_var,iVar1);
    if (local_8 == (blargg_err_t)0x0) {
      iVar1 = M3u_Playlist::size((M3u_Playlist *)0x954a30);
      if (iVar1 != 0) {
        M3u_Playlist::info(&in_RDI->playlist);
        copy_field_((char *)in_RDI,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        copy_field_((char *)in_RDI,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        copy_field_((char *)in_RDI,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        copy_field_((char *)in_RDI,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        peVar2 = M3u_Playlist::operator[]((M3u_Playlist *)in_RDI,in_stack_ffffffffffffffac);
        copy_field_((char *)in_RDI,
                    (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        if (-1 < peVar2->length) {
          in_RSI[1] = (long)peVar2->length * 1000;
        }
        if (-1 < peVar2->intro) {
          in_RSI[2] = (long)peVar2->intro * 1000;
        }
        if (-1 < peVar2->loop) {
          in_RSI[3] = (long)peVar2->loop * 1000;
        }
      }
      local_8 = (blargg_err_t)0x0;
    }
  }
  return local_8;
}

Assistant:

blargg_err_t Gme_File::track_info( track_info_t* out, int track ) const
{
	out->track_count = track_count();
	out->length        = -1;
	out->loop_length   = -1;
	out->intro_length  = -1;
	out->song [0]      = 0;
	
	out->game [0]      = 0;
	out->author [0]    = 0;
	out->copyright [0] = 0;
	out->comment [0]   = 0;
	out->dumper [0]    = 0;
	out->system [0]    = 0;
	
	copy_field_( out->system, type()->system );
	
	int remapped = track;
	RETURN_ERR( remap_track_( &remapped ) );
	RETURN_ERR( track_info_( out, remapped ) );
	
	// override with m3u info
	if ( playlist.size() )
	{
		M3u_Playlist::info_t const& i = playlist.info();
		copy_field_( out->game  , i.title );
		copy_field_( out->author, i.engineer );
		copy_field_( out->author, i.composer );
		copy_field_( out->dumper, i.ripping );
		
		M3u_Playlist::entry_t const& e = playlist [track];
		copy_field_( out->song, e.name );
		if ( e.length >= 0 ) out->length       = e.length * 1000L;
		if ( e.intro  >= 0 ) out->intro_length = e.intro  * 1000L;
		if ( e.loop   >= 0 ) out->loop_length  = e.loop   * 1000L;
	}
	return 0;
}